

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::NamedBase::AddDescriptionPostfix
          (NamedBase *this,string *dest,bool isManual,string *manual,bool isGenerated,
          string *generated,string *str)

{
  size_type sVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,isManual) == 0) {
    if (!isGenerated) {
      return;
    }
    sVar1 = generated->_M_string_length;
  }
  else {
    sVar1 = manual->_M_string_length;
  }
  if (sVar1 == 0) {
    return;
  }
  std::__cxx11::string::append((string *)dest);
  std::__cxx11::string::append((string *)dest);
  return;
}

Assistant:

void AddDescriptionPostfix(std::string &dest, const bool isManual, const std::string &manual, bool isGenerated, const std::string &generated, const std::string &str) const
            {
                if (isManual && !manual.empty())
                {
                    dest += str;
                    dest += manual;
                }
                else if (!isManual && isGenerated && !generated.empty())
                {
                    dest += str;
                    dest += generated;
                }
            }